

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_add_qua_as_tri(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *qua_nodes)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  REF_GLOB qua_global [27];
  REF_INT local_168;
  undefined4 uStack_164;
  REF_INT RStack_160;
  REF_INT local_15c;
  long local_f8 [27];
  
  local_15c = qua_nodes[4];
  lVar3 = 0;
  do {
    iVar1 = qua_nodes[lVar3];
    lVar5 = -1;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar5 = ref_node->global[iVar1], lVar5 < 0)) {
      lVar5 = -1;
    }
    local_f8[lVar3] = lVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if ((local_f8[0] < local_f8[1] && local_f8[0] < local_f8[3]) ||
     (local_f8[2] < local_f8[3] && local_f8[2] < local_f8[1])) {
    local_168 = *qua_nodes;
    uStack_164 = (undefined4)*(undefined8 *)(qua_nodes + 2);
    RStack_160 = (REF_INT)((ulong)*(undefined8 *)(qua_nodes + 2) >> 0x20);
    uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
    if (uVar2 == 0) {
      local_168 = (REF_INT)*(undefined8 *)qua_nodes;
      uStack_164 = (undefined4)((ulong)*(undefined8 *)qua_nodes >> 0x20);
      RStack_160 = qua_nodes[2];
      uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
      if (uVar2 == 0) {
        return 0;
      }
      uVar4 = 0x440;
    }
    else {
      uVar4 = 0x43c;
    }
  }
  else {
    local_168 = (REF_INT)*(undefined8 *)qua_nodes;
    uStack_164 = (undefined4)((ulong)*(undefined8 *)qua_nodes >> 0x20);
    RStack_160 = qua_nodes[3];
    uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
    if (uVar2 == 0) {
      local_168 = (REF_INT)*(undefined8 *)(qua_nodes + 2);
      uStack_164 = (undefined4)((ulong)*(undefined8 *)(qua_nodes + 2) >> 0x20);
      RStack_160 = qua_nodes[1];
      uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
      if (uVar2 == 0) {
        return 0;
      }
      uVar4 = 0x44c;
    }
    else {
      uVar4 = 0x448;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar4,
         "ref_shard_add_qua_as_tri",(ulong)uVar2,"a tri");
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_qua_as_tri(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *qua_nodes) {
  REF_GLOB qua_global[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];

  tri_nodes[3] = qua_nodes[4]; /* patch id */

  for (node = 0; node < 4; node++)
    qua_global[node] = ref_node_global(ref_node, qua_nodes[node]);

  if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
      (qua_global[2] < qua_global[1] &&
       qua_global[2] < qua_global[3])) { /* 0-2 diag split of quad */
                                         /* 2-1
                                            |\|
                                            3-0 */
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[2];
    tri_nodes[2] = qua_nodes[3];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[1];
    tri_nodes[2] = qua_nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
  } else { /* 3-1 diag split of quad */
           /* 2-1
              |/|
              3-0 */
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[1];
    tri_nodes[2] = qua_nodes[3];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
    tri_nodes[0] = qua_nodes[2];
    tri_nodes[1] = qua_nodes[3];
    tri_nodes[2] = qua_nodes[1];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
  }
  return REF_SUCCESS;
}